

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O3

void getChildItem(string *path)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  ostream *poVar6;
  undefined1 *puVar7;
  char *__s;
  long lVar8;
  string names [100];
  char *local_d18;
  long local_d10;
  char local_d08 [16];
  char *local_cf8;
  long local_cf0;
  char local_ce8 [16];
  string local_cd8;
  string local_cb8 [99];
  undefined8 auStack_58 [2];
  char local_48 [24];
  
  lVar4 = 0x10;
  do {
    puVar7 = (undefined1 *)((long)&local_cb8[0]._M_dataplus._M_p + lVar4);
    *(undefined1 **)((long)local_cb8 + lVar4 + -0x10) = puVar7;
    *(undefined8 *)((long)local_cb8 + lVar4 + -8) = 0;
    *puVar7 = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xc90);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cd8,pcVar1,pcVar1 + path->_M_string_length);
  iVar2 = parsePath(&local_cd8,local_cb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  pcVar1 = (path->_M_dataplus)._M_p;
  local_cf8 = local_ce8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cf8,pcVar1,pcVar1 + path->_M_string_length);
  iVar3 = doesExist(local_cb8,iVar2,local_cf0 == 0 || *local_cf8 != '/');
  if (local_cf8 != local_ce8) {
    operator_delete(local_cf8);
  }
  if (iVar3 == iVar2) {
    pcVar1 = (path->_M_dataplus)._M_p;
    local_d18 = local_d08;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d18,pcVar1,pcVar1 + path->_M_string_length);
    iVar2 = getId(local_cb8,iVar2,local_d10 == 0 || *local_d18 != '/');
    if (local_d18 != local_d08) {
      operator_delete(local_d18);
    }
    lVar4 = (long)inodes[iVar2].i_blocks[0] * 0x1000;
    lVar8 = 0;
    do {
      if (emptyspaces[lVar8 + lVar4] != '\0') {
        __s = emptyspaces + lVar8 + lVar4;
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            inodes[*(int *)(emptyspaces + lVar8 + lVar4 + 0xfc)].i_file_size);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"B",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      lVar8 = lVar8 + 0x100;
    } while (lVar8 != 0x1000);
  }
  else {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": No such file or directory.\n",0x1d)
    ;
  }
  lVar4 = 0;
  do {
    if (local_48 + lVar4 != *(char **)((long)auStack_58 + lVar4)) {
      operator_delete(*(char **)((long)auStack_58 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0xc80);
  return;
}

Assistant:

void getChildItem(string path) {
    int cur_inode;
    string names[100];
    int layers = parsePath(path, names);
    if (doesExist(names, layers, getPathType(path) == RELATIVE_PATH) != layers) {
        cout << path << ": No such file or directory.\n";
        return;
    }
    cur_inode = getId(names, layers, getPathType(path) == RELATIVE_PATH);
    int blocks = inodes[cur_inode].i_blocks[0];
    dir_block *p = getAddressByLocation_Folder(blocks);
    for (int i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "") != 0)//非空
        {
            if (inodes[p->dirs[i].inode_id].i_mode == A_FOLDER)
            {
                setColor(COLOR_FOLDER);
            }
            cout << p->dirs[i].name << "\t" << inodes[p->dirs[i].inode_id].i_file_size << "B" << endl;
            setColor(COLOR_ORIGIN);
        }
    }
}